

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_affinity_invalid_mask(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  undefined1 *nread;
  uv_stream_t *stream;
  char newmask [1];
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_810 [24];
  uv_buf_t uStack_7f8;
  uv_fs_t uStack_7e0;
  uv_pipe_t uStack_620;
  uv_stdio_container_t uStack_538;
  undefined4 uStack_528;
  undefined4 uStack_518;
  anon_union_8_2_13e1ed65_for_data aStack_500;
  long lStack_4c8;
  uint uStack_4c0;
  int iStack_4bc;
  uv_buf_t uStack_4b8;
  char acStack_4a8 [16];
  uv_stdio_container_t uStack_498;
  uv_write_t uStack_488;
  uv_write_t uStack_3c0;
  uv_stream_t uStack_2f8;
  uv_fs_t uStack_210;
  anon_union_8_2_13e1ed65_for_data aStack_50;
  char local_19;
  uv__queue *local_18;
  uv__queue *local_10;
  
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf0dd:
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf0e2:
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    init_process_options("",exit_cb);
    options.cpumask = &local_19;
    local_19 = '\0';
    options.cpumask_size = 0;
    unaff_RBX = &options;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    if (iVar1 != -0x16) goto LAB_001bf0dd;
    if (exit_cb_called != 0) goto LAB_001bf0e2;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_10 = (uv__queue *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    local_18 = (uv__queue *)(long)iVar1;
    if (local_10 == local_18) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_affinity_invalid_mask_cold_4();
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001bf262;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 0) goto LAB_001bf26f;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001bf27c;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 1) goto LAB_001bf289;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_auto_unref_cold_1();
LAB_001bf262:
    run_test_spawn_auto_unref_cold_2();
LAB_001bf26f:
    run_test_spawn_auto_unref_cold_3();
LAB_001bf27c:
    run_test_spawn_auto_unref_cold_4();
LAB_001bf289:
    run_test_spawn_auto_unref_cold_5();
  }
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_4a8,"/dev/null",10);
  aStack_50 = (anon_union_8_2_13e1ed65_for_data)unaff_RBX;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_210,acStack_4a8,2,0,(uv_fs_cb)0x0);
  uStack_2f8.data = (void *)(long)iVar1;
  uStack_3c0.data = (void *)0x0;
  if (uStack_2f8.data == (void *)0x0) {
    uStack_4c0 = (undefined4)uStack_210.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar2 = uv_default_loop();
    unaff_RBX = (uv_process_options_t *)&uStack_2f8;
    iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)unaff_RBX,0);
    uStack_3c0.data = (void *)(long)iVar1;
    uStack_488.data = (void *)0x0;
    if (uStack_3c0.data != (void *)0x0) goto LAB_001bf5ba;
    options.stdio = &uStack_498;
    uStack_498.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_498.data.stream = (uv_stream_t *)unaff_RBX;
    iStack_4bc = dup(uStack_4c0);
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    uStack_3c0.data = (void *)(long)iVar1;
    uStack_488.data = (void *)0x0;
    if (uStack_3c0.data != (void *)0x0) goto LAB_001bf5cc;
    uStack_4b8 = uv_buf_init((char *)&uStack_4c0,4);
    iVar1 = uv_write(&uStack_3c0,&uStack_2f8,&uStack_4b8,1,write_null_cb);
    uStack_488.data = (void *)(long)iVar1;
    if (uStack_488.data != (void *)0x0) goto LAB_001bf5de;
    uStack_4b8 = uv_buf_init((char *)&iStack_4bc,4);
    iVar1 = uv_write(&uStack_488,&uStack_2f8,&uStack_4b8,1,write_cb);
    lStack_4c8 = 0;
    if (iVar1 != 0) goto LAB_001bf5ed;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_4c8 = 0;
    if (iVar1 != 0) goto LAB_001bf5fc;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_210,uStack_4c0,(uv_fs_cb)0x0);
    lStack_4c8 = 0;
    if (iVar1 != 0) goto LAB_001bf60b;
    lStack_4c8 = (long)exit_cb_called;
    if (lStack_4c8 != 1) goto LAB_001bf61a;
    lStack_4c8 = (long)close_cb_called;
    if (lStack_4c8 != 2) goto LAB_001bf629;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    lStack_4c8 = (long)iVar1;
    if (lStack_4c8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5ba:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5cc:
    run_test_spawn_fs_open_cold_3();
LAB_001bf5de:
    run_test_spawn_fs_open_cold_4();
LAB_001bf5ed:
    run_test_spawn_fs_open_cold_5();
LAB_001bf5fc:
    run_test_spawn_fs_open_cold_6();
LAB_001bf60b:
    run_test_spawn_fs_open_cold_7();
LAB_001bf61a:
    run_test_spawn_fs_open_cold_8();
LAB_001bf629:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_4c8;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_500 = (anon_union_8_2_13e1ed65_for_data)unaff_RBX;
  uStack_7f8 = uv_buf_init("",1);
  iVar1 = uv_pipe((uv_os_fd_t *)(auStack_810 + 0x10),0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_538;
    uStack_538.flags = UV_INHERIT_FD;
    uStack_538.data.file = auStack_810._16_4_;
    uStack_528 = 0;
    uStack_518 = 0;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    uStack_7e0.data = (void *)(long)iVar1;
    uStack_620.data = (void *)0x0;
    if ((uv_handle_t *)uStack_7e0.data != (uv_handle_t *)0x0) goto LAB_001bfaf5;
    uv_unref((uv_handle_t *)&process);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&uStack_620,0);
    uStack_7e0.data = (void *)(long)iVar1;
    auStack_810._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_7e0.data != (uv_handle_t *)0x0) goto LAB_001bfb07;
    iVar1 = uv_pipe_open(&uStack_620,auStack_810._16_4_);
    uStack_7e0.data = (void *)(long)iVar1;
    auStack_810._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_7e0.data != (uv_handle_t *)0x0) goto LAB_001bfb16;
    auStack_810._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start((uv_stream_t *)&uStack_620,on_alloc,on_read_once);
    uStack_7e0.data = (void *)(long)iVar1;
    auStack_810._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_7e0.data != (uv_handle_t *)0x0) goto LAB_001bfb25;
    auStack_810._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&uStack_7e0,auStack_810._20_4_,&uStack_7f8,1,-1,
                        (uv_fs_cb)0x0);
    auStack_810._8_8_ = SEXT48(iVar1);
    if (auStack_810._0_8_ != auStack_810._8_8_) goto LAB_001bfb34;
    auStack_810._0_8_ = (uv_loop_t *)0x1;
    auStack_810._8_8_ = uStack_7e0.result;
    if ((uv_loop_t *)uStack_7e0.result != (uv_loop_t *)0x1) goto LAB_001bfb43;
    uv_fs_req_cleanup(&uStack_7e0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    auStack_810._0_8_ = SEXT48(iVar1);
    auStack_810._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_810._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb52;
    auStack_810._0_8_ = (uv_loop_t *)0x1;
    auStack_810._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_810._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb61;
    uv_close((uv_handle_t *)&uStack_620,close_cb);
    auStack_810._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&uStack_7e0,auStack_810._20_4_,&uStack_7f8,1,-1,
                        (uv_fs_cb)0x0);
    auStack_810._8_8_ = SEXT48(iVar1);
    if (auStack_810._0_8_ != auStack_810._8_8_) goto LAB_001bfb70;
    auStack_810._0_8_ = (uv_loop_t *)0x1;
    auStack_810._8_8_ = uStack_7e0.result;
    if ((uv_loop_t *)uStack_7e0.result != (uv_loop_t *)0x1) goto LAB_001bfb7f;
    uv_fs_req_cleanup(&uStack_7e0);
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    auStack_810._0_8_ = SEXT48(iVar1);
    auStack_810._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_810._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb8e;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_810._0_8_ = SEXT48(iVar1);
    auStack_810._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_810._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb9d;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 1) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_ONCE);
      auStack_810._0_8_ = SEXT48(iVar1);
      auStack_810._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_810._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe8;
    }
    auStack_810._0_8_ = (uv_loop_t *)0x1;
    auStack_810._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_810._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbac;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_810._0_8_ = SEXT48(iVar1);
    auStack_810._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_810._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbbb;
    iVar1 = close(auStack_810._20_4_);
    auStack_810._0_8_ = SEXT48(iVar1);
    auStack_810._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_810._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbca;
    auStack_810._20_4_ = -1;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_810._0_8_ = (uv_loop_t *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    auStack_810._8_8_ = SEXT48(iVar1);
    if (auStack_810._0_8_ == auStack_810._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfaf5:
    run_test_closed_fd_events_cold_2();
LAB_001bfb07:
    run_test_closed_fd_events_cold_3();
LAB_001bfb16:
    run_test_closed_fd_events_cold_4();
LAB_001bfb25:
    run_test_closed_fd_events_cold_5();
LAB_001bfb34:
    run_test_closed_fd_events_cold_6();
LAB_001bfb43:
    run_test_closed_fd_events_cold_7();
LAB_001bfb52:
    run_test_closed_fd_events_cold_8();
LAB_001bfb61:
    run_test_closed_fd_events_cold_9();
LAB_001bfb70:
    run_test_closed_fd_events_cold_10();
LAB_001bfb7f:
    run_test_closed_fd_events_cold_11();
LAB_001bfb8e:
    run_test_closed_fd_events_cold_12();
LAB_001bfb9d:
    run_test_closed_fd_events_cold_13();
LAB_001bfbac:
    run_test_closed_fd_events_cold_15();
LAB_001bfbbb:
    run_test_closed_fd_events_cold_16();
LAB_001bfbca:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfbe8:
  stream = (uv_stream_t *)auStack_810;
  nread = auStack_810 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_affinity_invalid_mask) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int r;
  char newmask[1];
  int cpumask_size;

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  init_process_options("", exit_cb);

  /* provide a mask that is too small */
  newmask[0] = 0;
  options.cpumask_size = 0;
  options.cpumask = newmask;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_EINVAL);

  ASSERT(exit_cb_called == 0);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}